

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O2

void __thiscall
despot::FullChainBelief::FullChainBelief
          (FullChainBelief *this,DSPOMDP *model,int num_mdp_states,int num_mdp_actions,double alpha)

{
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  *this_00;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  allocator_type local_71;
  FullChainBelief *local_70;
  size_type local_68;
  ulong local_60;
  ulong local_58;
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_50 = alpha;
  despot::Belief::Belief(&this->super_Belief,model);
  *(undefined ***)this = &PTR__FullChainBelief_00110a58;
  this_00 = &this->alpha_;
  (this->alpha_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->alpha_).
  super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->alpha_).
           super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4) = 0;
  local_70 = this;
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::resize(this_00,(long)num_mdp_states);
  local_68 = (size_type)num_mdp_actions;
  uVar2 = 0;
  uVar1 = 0;
  if (0 < num_mdp_actions) {
    uVar1 = (ulong)(uint)num_mdp_actions;
  }
  local_60 = (ulong)(uint)num_mdp_states;
  if (num_mdp_states < 1) {
    local_60 = uVar2;
  }
  while (uVar2 != local_60) {
    local_58 = uVar2;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize((this_00->
             super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + uVar2,local_68);
    for (lVar3 = 0; uVar1 * 0x18 - lVar3 != 0; lVar3 = lVar3 + 0x18) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_48,(long)num_mdp_states,&local_50
                 ,&local_71);
      std::vector<double,_std::allocator<double>_>::_M_move_assign
                ((vector<double,_std::allocator<double>_> *)
                 (*(long *)&(this_00->
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar2].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data + lVar3),&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
    }
    uVar2 = local_58 + 1;
  }
  return;
}

Assistant:

FullChainBelief::FullChainBelief(const DSPOMDP* model, int num_mdp_states,
	int num_mdp_actions, double alpha) :
	Belief(model),
	cur_state_(0) {
	alpha_.resize(num_mdp_states);
	for (int s = 0; s < num_mdp_states; s++) {
		alpha_[s].resize(num_mdp_actions);
		for (int a = 0; a < num_mdp_actions; a++) {
			alpha_[s][a] = vector<double>(num_mdp_states, alpha);
		}
	}
}